

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O2

void dropt_init_help_params(dropt_help_params *helpParams)

{
  if (helpParams != (dropt_help_params *)0x0) {
    helpParams->indent = 2;
    helpParams->description_start_column = 6;
    helpParams->blank_lines_between_options = '\x01';
    return;
  }
  dropt_misuse("No dropt help parameters specified.",
               "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c",
               0x5e5);
}

Assistant:

void
dropt_init_help_params(dropt_help_params* helpParams)
{
    if (helpParams == NULL)
    {
        DROPT_MISUSE("No dropt help parameters specified.");
        return;
    }

    helpParams->indent = default_help_indent;
    helpParams->description_start_column = default_description_start_column;
    helpParams->blank_lines_between_options = true;
}